

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O1

Boxed_Value __thiscall
chaiscript::dispatch::Bound_Function::do_call
          (Bound_Function *this,Function_Params *params,Type_Conversions_State *t_conversions)

{
  Function_Params *params_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar1;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> local_48;
  Type_Conversions_State local_30;
  
  params_00 = (Function_Params *)params[2].m_end;
  build_param_list(&local_48,(Bound_Function *)params,(Function_Params *)t_conversions);
  local_30.m_conversions._M_data =
       (Type_Conversions *)
       local_48.
       super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>._M_impl
       .super__Vector_impl_data._M_start;
  if (local_48.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_48.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_30.m_conversions._M_data = (Type_Conversions *)0x0;
  }
  local_30.m_saves._M_data =
       (Conversion_Saves *)
       local_48.
       super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (local_48.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_48.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_30.m_saves._M_data = (Conversion_Saves *)(Type_Conversions *)0x0;
  }
  Proxy_Function_Base::operator()(&this->super_Proxy_Function_Base,params_00,&local_30);
  Catch::clara::std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::
  ~vector(&local_48);
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value do_call(const Function_Params &params, const Type_Conversions_State &t_conversions) const override {
        return (*m_f)(Function_Params{build_param_list(params)}, t_conversions);
      }